

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  ulong uVar1;
  string *psVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  bool local_21;
  iterator *this_local;
  
  this->m_pos = this->m_len + this->m_pos;
  uVar1 = this->m_pos;
  psVar2 = line_abi_cxx11_(this);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (psVar2);
  if (uVar1 < sVar3) {
    psVar2 = line_abi_cxx11_(this);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](psVar2,this->m_pos);
    if (*pvVar4 == '\n') {
      this->m_pos = this->m_pos + 1;
      goto LAB_001941a1;
    }
  }
  while( true ) {
    uVar1 = this->m_pos;
    psVar2 = line_abi_cxx11_(this);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (psVar2);
    local_21 = false;
    if (uVar1 < sVar3) {
      psVar2 = line_abi_cxx11_(this);
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](psVar2,this->m_pos);
      local_21 = isWhitespace(*pvVar4);
    }
    if (local_21 == false) break;
    this->m_pos = this->m_pos + 1;
  }
LAB_001941a1:
  sVar3 = this->m_pos;
  psVar2 = line_abi_cxx11_(this);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (psVar2);
  if (sVar3 == sVar5) {
    this->m_pos = 0;
    this->m_stringIndex = this->m_stringIndex + 1;
  }
  uVar1 = this->m_stringIndex;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_column->m_strings);
  if (uVar1 < sVar6) {
    calcLength(this);
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			m_pos += m_len;
			if (m_pos < line().size() && line()[m_pos] == '\n')
				m_pos += 1;
			else
				while (m_pos < line().size() && isWhitespace(line()[m_pos]))
					++m_pos;

			if (m_pos == line().size()) {
				m_pos = 0;
				++m_stringIndex;
			}
			if (m_stringIndex < m_column.m_strings.size())
				calcLength();
			return *this;
		}